

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void __thiscall r_code::Code::load(Code *this,SysObject *source)

{
  int iVar1;
  Atom *pAVar2;
  undefined4 extraout_var;
  uint uVar3;
  size_t i;
  
  if (*(long *)(source + 0x10) != *(long *)(source + 8)) {
    i = 0;
    uVar3 = 0;
    do {
      pAVar2 = vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(source + 8),i);
      iVar1 = (*(this->super__Object)._vptr__Object[4])(this,(ulong)(uVar3 & 0xffff));
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),pAVar2);
      uVar3 = (uVar3 & 0xffff) + 1;
      i = (size_t)(uVar3 & 0xffff);
    } while (i < (ulong)(*(long *)(source + 0x10) - *(long *)(source + 8) >> 2));
  }
  (*(this->super__Object)._vptr__Object[3])(this,(ulong)*(uint *)(source + 0x68));
  return;
}

Assistant:

void load(SysObject *source)
    {
        for (uint16_t i = 0; i < source->code.size(); ++i) {
            code(i) = source->code[i];
        }

        set_oid(source->oid);
    }